

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O0

err_t g12sSign(octet *sig,g12s_params *params,octet *hash,octet *privkey,gen_i rng,void *rng_stack)

{
  bool_t bVar1;
  int iVar2;
  word *b;
  void *stack_00;
  word *a;
  gen_i a_00;
  gen_i mod;
  gen_i dest;
  word *in_RCX;
  void *in_RDX;
  g12s_deep_i in_RSI;
  g12s_params *in_RDI;
  word *in_R8;
  ec_o *in_R9;
  void *stack;
  word *s;
  word *r;
  word *C;
  word *k;
  word *e;
  word *d;
  ec_o *ec;
  size_t mo;
  size_t m;
  err_t code;
  void *in_stack_ffffffffffffff68;
  gen_i rng_00;
  word *c;
  word *a_01;
  long *stack_01;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar3;
  
  stack_01 = (long *)0x0;
  if (in_R8 == (word *)0x0) {
    eVar3 = 0x130;
  }
  else {
    eVar3 = g12sEcCreate((ec_o **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI,in_RSI);
    if (eVar3 == 0) {
      b = (word *)(ulong)(*(int *)in_RSI + 0x3fU >> 6);
      stack_00 = (void *)(ulong)(*(int *)in_RSI + 7U >> 3);
      bVar1 = memIsValid(in_RDX,(size_t)stack_00);
      if (((bVar1 == 0) || (bVar1 = memIsValid(in_RCX,(size_t)stack_00), bVar1 == 0)) ||
         (bVar1 = memIsValid(in_RDI,(long)stack_00 << 1), bVar1 == 0)) {
        g12sEcClose((ec_o *)0x16722d);
        eVar3 = 0x6d;
      }
      else {
        a = (word *)((long)stack_01 + *stack_01);
        a_01 = a + (long)b;
        c = a_01 + (long)b;
        rng_00 = (gen_i)(c + (long)b);
        a_00 = rng_00 + *(long *)(stack_01[3] + 0x30) * 0x10;
        mod = a_00 + (long)b * 8;
        dest = mod + (long)b * 8;
        u64From((u64 *)dest,in_stack_ffffffffffffff68,0x1672f2);
        bVar1 = wwIsZero(a,(size_t)b);
        if ((bVar1 == 0) && (iVar2 = wwCmp(a,(word *)stack_01[7],(size_t)b), iVar2 < 0)) {
          memCopy(dest,in_stack_ffffffffffffff68,0x167351);
          memRev(a_01,(size_t)stack_00);
          u64From((u64 *)dest,in_stack_ffffffffffffff68,0x167374);
          zzMod(in_R8,(word *)in_R9,CONCAT44(eVar3,in_stack_ffffffffffffffc0),b,(size_t)stack_00,
                stack_01);
          bVar1 = wwIsZero(a_01,(size_t)b);
          if (bVar1 != 0) {
            *a_01 = 1;
          }
          do {
            bVar1 = zzRandNZMod(a,a_01,(size_t)c,rng_00,a_00);
            if (bVar1 == 0) {
              g12sEcClose((ec_o *)0x1673ee);
              return 0x130;
            }
            bVar1 = ecMulA(in_RCX,in_R8,in_R9,(word *)CONCAT44(eVar3,in_stack_ffffffffffffffc0),
                           (size_t)b,stack_00);
            if (bVar1 == 0) {
              g12sEcClose((ec_o *)0x167434);
              return 0x6d;
            }
            (**(code **)(stack_01[3] + 0x48))(rng_00,rng_00,stack_01[3],dest);
            u64From((u64 *)dest,in_stack_ffffffffffffff68,0x167487);
            zzMod(in_R8,(word *)in_R9,CONCAT44(eVar3,in_stack_ffffffffffffffc0),b,(size_t)stack_00,
                  stack_01);
            bVar1 = wwIsZero((word *)a_00,(size_t)b);
          } while (bVar1 != 0);
          zzMulMod(c,(word *)rng_00,(word *)a_00,(word *)mod,(size_t)dest,in_stack_ffffffffffffff68)
          ;
          zzMulMod(c,(word *)rng_00,(word *)a_00,(word *)mod,(size_t)dest,in_stack_ffffffffffffff68)
          ;
          zzAddMod(a,a_01,c,(word *)rng_00,(size_t)a_00);
          u64To(dest,(size_t)in_stack_ffffffffffffff68,(u64 *)0x167556);
          u64To(dest,(size_t)in_stack_ffffffffffffff68,(u64 *)0x167572);
          memRev(in_RDI,(long)stack_00 << 1);
          g12sEcClose((ec_o *)0x167591);
          eVar3 = 0;
        }
        else {
          g12sEcClose((ec_o *)0x16732d);
          eVar3 = 0x1f8;
        }
      }
    }
  }
  return eVar3;
}

Assistant:

err_t g12sSign(octet sig[], const g12s_params* params, const octet hash[],
	const octet privkey[], gen_i rng, void* rng_stack)
{
	err_t code;
	size_t m, mo;
	// состояние
	ec_o* ec = 0;
	word* d;		/* [m] личный ключ */
	word* e;		/* [m] обработанное хэш-значение */
	word* k;		/* [m] одноразовый ключ */
	word* C;		/* [2n] вспомогательная точка */
	word* r;		/* [m] первая (старшая) часть подписи */
	word* s;		/* [m] вторая часть подписи */
	void* stack;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// старт
	code = g12sEcCreate(&ec, params, g12sSign_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	m = W_OF_B(params->l);
	mo = O_OF_B(params->l);
	// проверить входные указатели
	if (!memIsValid(hash, mo) ||
		!memIsValid(privkey, mo) ||
		!memIsValid(sig, 2 * mo))
	{
		g12sEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	e = d + m;
	k = e + m;
	C = k + m;
	r = C + 2 * ec->f->n;
	s = r + m;
	stack = s + m;
	// загрузить d
	wwFrom(d, privkey, mo);
	if (wwIsZero(d, m) || 
		wwCmp(d, ec->order, m) >= 0)
	{
		g12sEcClose(ec);
		return ERR_BAD_PRIVKEY;
	}
	// e <- hash \mod q
	memCopy(e, hash, mo);
	memRev(e, mo);
	wwFrom(e, e, mo);
	zzMod(e, e, m, ec->order, m, stack);
	// e == 0 => e <- 1
	if (wwIsZero(e, m))
		e[0] = 1;
	// k <-R {1,2,..., q - 1}
gen_k:
	if (!zzRandNZMod(k, ec->order, m, rng, rng_stack))
	{
		g12sEcClose(ec);
		return ERR_BAD_RNG;
	}
	// C <- k P
	if (!ecMulA(C, ec->base, ec, k, m, stack))
	{
		// если params корректны, то этого быть не должно
		g12sEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// r <- x_C \mod q
	qrTo((octet*)C, ecX(C), ec->f, stack);
	wwFrom(r, C, ec->f->no);
	zzMod(r, r, ec->f->n, ec->order, m, stack);
	// r == 0 => повторить генерацию k
	if (wwIsZero(r, m))
		goto gen_k;
	// s <- (rd + ke) \mod q
	zzMulMod(k, k, e, ec->order, m, stack);
	zzMulMod(s, r, d, ec->order, m, stack);
	zzAddMod(s, s, k, ec->order, m);
	// выгрузить ЭЦП
	wwTo(sig, mo, s);
	wwTo(sig + mo, mo, r);
	memRev(sig, 2 * mo);
	// все нормально
	g12sEcClose(ec);
	return ERR_OK;
}